

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

nn_queue_item * nn_queue_pop(nn_queue *self)

{
  nn_queue_item *result;
  nn_queue *self_local;
  
  if (self->head == (nn_queue_item *)0x0) {
    self_local = (nn_queue *)0x0;
  }
  else {
    self_local = (nn_queue *)self->head;
    self->head = self_local->head;
    if (self->head == (nn_queue_item *)0x0) {
      self->tail = (nn_queue_item *)0x0;
    }
    self_local->head = (nn_queue_item *)0xffffffffffffffff;
  }
  return (nn_queue_item *)self_local;
}

Assistant:

struct nn_queue_item *nn_queue_pop (struct nn_queue *self)
{
    struct nn_queue_item *result;

    if (!self->head)
        return NULL;
    result = self->head;
    self->head = result->next;
    if (!self->head)
        self->tail = NULL;
    result->next = NN_QUEUE_NOTINQUEUE;
    return result;
}